

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_storage.cpp
# Opt level: O2

BlockPointer duckdb::BlockPointer::Deserialize(Deserializer *deserializer)

{
  uint uVar1;
  BlockPointer BVar2;
  
  BVar2.block_id = Deserializer::ReadProperty<long>(deserializer,100,"block_id");
  uVar1 = Deserializer::ReadPropertyWithDefault<unsigned_int>(deserializer,0x65,"offset");
  BVar2.offset = uVar1;
  BVar2.unused_padding = 0;
  return BVar2;
}

Assistant:

BlockPointer BlockPointer::Deserialize(Deserializer &deserializer) {
	auto block_id = deserializer.ReadProperty<block_id_t>(100, "block_id");
	auto offset = deserializer.ReadPropertyWithDefault<uint32_t>(101, "offset");
	BlockPointer result(block_id, offset);
	return result;
}